

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LDecodeImage(VP8LDecoder *dec)

{
  VP8Io *pVVar1;
  int iVar2;
  VP8LDecoder *in_RDI;
  VP8Io *unaff_retaddr;
  WebPDecParams *params;
  VP8Io *io;
  VP8Io *in_stack_00000030;
  VP8LDecoder *in_stack_00000038;
  ProcessRowsFunc in_stack_00000088;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  uint32_t *in_stack_000000a0;
  VP8LDecoder *in_stack_000000a8;
  VP8LColorCache *in_stack_ffffffffffffffd8;
  VP8LDecoder *dec_00;
  undefined4 in_stack_fffffffffffffff8;
  WEBP_CSP_MODE in_stack_fffffffffffffffc;
  
  if (in_RDI == (VP8LDecoder *)0x0) {
    return 0;
  }
  pVVar1 = in_RDI->io;
  dec_00 = (VP8LDecoder *)pVVar1->opaque;
  if (in_RDI->state != READ_DATA) {
    in_RDI->output = *(WebPDecBuffer **)dec_00;
    iVar2 = WebPIoInitFromOptions
                      ((WebPDecoderOptions *)params,unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar2 == 0) {
      VP8LSetError(in_RDI,VP8_STATUS_INVALID_PARAM);
      goto LAB_0010fba6;
    }
    iVar2 = AllocateInternalBuffers32b
                      ((VP8LDecoder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20));
    if ((iVar2 == 0) ||
       ((pVVar1->use_scaling != 0 &&
        (iVar2 = AllocateAndInitRescaler(in_stack_00000038,in_stack_00000030), iVar2 == 0))))
    goto LAB_0010fba6;
    if ((pVVar1->use_scaling != 0) ||
       (iVar2 = WebPIsPremultipliedMode(in_RDI->output->colorspace), iVar2 != 0)) {
      WebPInitAlphaProcessing();
    }
    iVar2 = WebPIsRGBMode(in_RDI->output->colorspace);
    if ((iVar2 == 0) && (WebPInitConvertARGBToYUV(), (in_RDI->output->u).YUVA.a != (uint8_t *)0x0))
    {
      WebPInitAlphaProcessing();
    }
    if ((((in_RDI->incremental != 0) && (0 < (in_RDI->hdr).color_cache_size)) &&
        ((in_RDI->hdr).saved_color_cache.colors == (uint32_t *)0x0)) &&
       (iVar2 = VP8LColorCacheInit(in_stack_ffffffffffffffd8,0), iVar2 == 0)) {
      VP8LSetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY);
      goto LAB_0010fba6;
    }
    in_RDI->state = READ_DATA;
  }
  iVar2 = DecodeImageData(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                          in_stack_00000094,in_stack_00000088);
  if (iVar2 != 0) {
    *(int *)&dec_00->argb_cache = in_RDI->last_out_row;
    return 1;
  }
LAB_0010fba6:
  VP8LClear(dec_00);
  return 0;
}

Assistant:

int VP8LDecodeImage(VP8LDecoder* const dec) {
  VP8Io* io = NULL;
  WebPDecParams* params = NULL;

  if (dec == NULL) return 0;

  assert(dec->hdr.huffman_tables.root.start != NULL);
  assert(dec->hdr.htree_groups != NULL);
  assert(dec->hdr.num_htree_groups > 0);

  io = dec->io;
  assert(io != NULL);
  params = (WebPDecParams*)io->opaque;
  assert(params != NULL);

  // Initialization.
  if (dec->state != READ_DATA) {
    dec->output = params->output;
    assert(dec->output != NULL);

    if (!WebPIoInitFromOptions(params->options, io, MODE_BGRA)) {
      VP8LSetError(dec, VP8_STATUS_INVALID_PARAM);
      goto Err;
    }

    if (!AllocateInternalBuffers32b(dec, io->width)) goto Err;

#if !defined(WEBP_REDUCE_SIZE)
    if (io->use_scaling && !AllocateAndInitRescaler(dec, io)) goto Err;
#else
    if (io->use_scaling) {
      VP8LSetError(dec, VP8_STATUS_INVALID_PARAM);
      goto Err;
    }
#endif
    if (io->use_scaling || WebPIsPremultipliedMode(dec->output->colorspace)) {
      // need the alpha-multiply functions for premultiplied output or rescaling
      WebPInitAlphaProcessing();
    }

    if (!WebPIsRGBMode(dec->output->colorspace)) {
      WebPInitConvertARGBToYUV();
      if (dec->output->u.YUVA.a != NULL) WebPInitAlphaProcessing();
    }
    if (dec->incremental) {
      if (dec->hdr.color_cache_size > 0 &&
          dec->hdr.saved_color_cache.colors == NULL) {
        if (!VP8LColorCacheInit(&dec->hdr.saved_color_cache,
                                dec->hdr.color_cache.hash_bits)) {
          VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
          goto Err;
        }
      }
    }
    dec->state = READ_DATA;
  }

  // Decode.
  if (!DecodeImageData(dec, dec->pixels, dec->width, dec->height,
                       io->crop_bottom, ProcessRows)) {
    goto Err;
  }

  params->last_y = dec->last_out_row;
  return 1;

 Err:
  VP8LClear(dec);
  assert(dec->status != VP8_STATUS_OK);
  return 0;
}